

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_quaternion_to_axis_angle(rf_quaternion q,rf_vec3 *outAxis,float *outAngle)

{
  undefined1 auVar1 [16];
  uint uVar2;
  double dVar3;
  ulong uVar4;
  undefined1 extraout_var [12];
  undefined1 auVar5 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float local_38;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  
  local_38 = q.z;
  fVar10 = q.w;
  fStack_20 = q.x;
  fStack_1c = q.y;
  local_28 = q.x;
  fStack_24 = q.y;
  if (1.0 < ABS(fVar10)) {
    fVar9 = SQRT(fVar10 * fVar10 + local_38 * local_38 + local_28 * local_28 + fStack_24 * fStack_24
                );
    uVar2 = -(uint)(fVar9 == 0.0);
    fVar9 = (float)(uVar2 & 0x3f800000 | ~uVar2 & (uint)(1.0 / fVar9));
    local_28 = local_28 * fVar9;
    fStack_24 = fStack_24 * fVar9;
    fStack_20 = fStack_20 * fVar9;
    fStack_1c = fStack_1c * fVar9;
    local_38 = local_38 * fVar9;
    fVar10 = fVar10 * fVar9;
  }
  dVar3 = acos((double)fVar10);
  fVar10 = 1.0 - fVar10 * fVar10;
  if (fVar10 < 0.0) {
    auVar8._0_4_ = sqrtf(fVar10);
    auVar8._4_12_ = extraout_var;
    uVar4 = auVar8._0_8_;
  }
  else {
    uVar4 = (ulong)(uint)SQRT(fVar10);
  }
  fVar10 = 0.0;
  auVar5._0_4_ = (float)uVar4;
  auVar1._4_4_ = fStack_24;
  auVar1._0_4_ = local_28;
  auVar1._8_4_ = fStack_20;
  auVar1._12_4_ = fStack_1c;
  if (0.0001 < auVar5._0_4_) {
    fVar10 = local_38 / auVar5._0_4_;
  }
  uVar7 = (undefined4)(uVar4 >> 0x20);
  auVar6._8_4_ = uVar7;
  auVar6._0_8_ = uVar4;
  auVar6._12_4_ = uVar7;
  auVar5._8_8_ = auVar6._8_8_;
  auVar5._4_4_ = auVar5._0_4_;
  auVar8 = divps(auVar1,auVar5);
  uVar2 = (int)((uint)(0.0001 < auVar5._0_4_) << 0x1f) >> 0x1f;
  uVar4 = (ulong)~uVar2 & 0xffffffff3f800000 |
          CONCAT44(auVar8._4_4_ & (int)((uint)(0.0001 < auVar5._0_4_) << 0x1f) >> 0x1f,
                   auVar8._0_4_ & uVar2);
  outAxis->x = (float)(int)uVar4;
  outAxis->y = (float)(int)(uVar4 >> 0x20);
  outAxis->z = fVar10;
  *outAngle = (float)dVar3 + (float)dVar3;
  return;
}

Assistant:

RF_API void rf_quaternion_to_axis_angle(rf_quaternion q, rf_vec3 *outAxis, float *outAngle)
{
    if (fabs(q.w) > 1.0f) q = rf_quaternion_normalize(q);

    rf_vec3 resAxis = {0.0f, 0.0f, 0.0f};
    float resAngle = 0.0f;

    resAngle = 2.0f * (float) acos(q.w);
    float den = (float) sqrt(1.0f - q.w * q.w);

    if (den > 0.0001f)
    {
        resAxis.x = q.x / den;
        resAxis.y = q.y / den;
        resAxis.z = q.z / den;
    } else
    {
        // This occurs when the angle is zero.
        // Not a problem: just set an arbitrary normalized axis.
        resAxis.x = 1.0f;
    }

    *outAxis = resAxis;
    *outAngle = resAngle;
}